

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_bcc(m68k_info *info,int size,int displacement)

{
  int in_ESI;
  undefined8 in_RDI;
  m68k_info *unaff_retaddr;
  
  build_relative_branch(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI);
  return;
}

Assistant:

static void build_bcc(m68k_info *info, int size, int displacement)
{
	build_relative_branch(info, s_branch_lut[(info->ir >> 8) & 0xf], size, displacement);
}